

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryGetEntry_FailureInvalidNegativeAge_Test::TestBody
          (NshHistoryGetEntry_FailureInvalidNegativeAge_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_8e8;
  Message local_8e0 [3];
  nsh_status local_8c4;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar;
  char acStack_8a8 [4];
  nsh_status_t status;
  char entry [128];
  undefined1 local_81c [8];
  nsh_history_t hist;
  NshHistoryGetEntry_FailureInvalidNegativeAge_Test *this_local;
  
  hist._2052_8_ = this;
  nsh_history_reset((nsh_history_t *)local_81c);
  entry[0x68] = '\0';
  entry[0x69] = '\0';
  entry[0x6a] = '\0';
  entry[0x6b] = '\0';
  entry[0x6c] = '\0';
  entry[0x6d] = '\0';
  entry[0x6e] = '\0';
  entry[0x6f] = '\0';
  entry[0x70] = '\0';
  entry[0x71] = '\0';
  entry[0x72] = '\0';
  entry[0x73] = '\0';
  entry[0x74] = '\0';
  entry[0x75] = '\0';
  entry[0x76] = '\0';
  entry[0x77] = '\0';
  entry[0x58] = '\0';
  entry[0x59] = '\0';
  entry[0x5a] = '\0';
  entry[0x5b] = '\0';
  entry[0x5c] = '\0';
  entry[0x5d] = '\0';
  entry[0x5e] = '\0';
  entry[0x5f] = '\0';
  entry[0x60] = '\0';
  entry[0x61] = '\0';
  entry[0x62] = '\0';
  entry[99] = '\0';
  entry[100] = '\0';
  entry[0x65] = '\0';
  entry[0x66] = '\0';
  entry[0x67] = '\0';
  entry[0x48] = '\0';
  entry[0x49] = '\0';
  entry[0x4a] = '\0';
  entry[0x4b] = '\0';
  entry[0x4c] = '\0';
  entry[0x4d] = '\0';
  entry[0x4e] = '\0';
  entry[0x4f] = '\0';
  entry[0x50] = '\0';
  entry[0x51] = '\0';
  entry[0x52] = '\0';
  entry[0x53] = '\0';
  entry[0x54] = '\0';
  entry[0x55] = '\0';
  entry[0x56] = '\0';
  entry[0x57] = '\0';
  entry[0x38] = '\0';
  entry[0x39] = '\0';
  entry[0x3a] = '\0';
  entry[0x3b] = '\0';
  entry[0x3c] = '\0';
  entry[0x3d] = '\0';
  entry[0x3e] = '\0';
  entry[0x3f] = '\0';
  entry[0x40] = '\0';
  entry[0x41] = '\0';
  entry[0x42] = '\0';
  entry[0x43] = '\0';
  entry[0x44] = '\0';
  entry[0x45] = '\0';
  entry[0x46] = '\0';
  entry[0x47] = '\0';
  entry[0x28] = '\0';
  entry[0x29] = '\0';
  entry[0x2a] = '\0';
  entry[0x2b] = '\0';
  entry[0x2c] = '\0';
  entry[0x2d] = '\0';
  entry[0x2e] = '\0';
  entry[0x2f] = '\0';
  entry[0x30] = '\0';
  entry[0x31] = '\0';
  entry[0x32] = '\0';
  entry[0x33] = '\0';
  entry[0x34] = '\0';
  entry[0x35] = '\0';
  entry[0x36] = '\0';
  entry[0x37] = '\0';
  entry[0x18] = '\0';
  entry[0x19] = '\0';
  entry[0x1a] = '\0';
  entry[0x1b] = '\0';
  entry[0x1c] = '\0';
  entry[0x1d] = '\0';
  entry[0x1e] = '\0';
  entry[0x1f] = '\0';
  entry[0x20] = '\0';
  entry[0x21] = '\0';
  entry[0x22] = '\0';
  entry[0x23] = '\0';
  entry[0x24] = '\0';
  entry[0x25] = '\0';
  entry[0x26] = '\0';
  entry[0x27] = '\0';
  entry[8] = '\0';
  entry[9] = '\0';
  entry[10] = '\0';
  entry[0xb] = '\0';
  entry[0xc] = '\0';
  entry[0xd] = '\0';
  entry[0xe] = '\0';
  entry[0xf] = '\0';
  entry[0x10] = '\0';
  entry[0x11] = '\0';
  entry[0x12] = '\0';
  entry[0x13] = '\0';
  entry[0x14] = '\0';
  entry[0x15] = '\0';
  entry[0x16] = '\0';
  entry[0x17] = '\0';
  _acStack_8a8 = 0;
  entry[0] = '\0';
  entry[1] = '\0';
  entry[2] = '\0';
  entry[3] = '\0';
  entry[4] = '\0';
  entry[5] = '\0';
  entry[6] = '\0';
  entry[7] = '\0';
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = nsh_history_get_entry((nsh_history_t *)local_81c,0xffffffff,acStack_8a8);
  local_8c4 = NSH_STATUS_WRONG_ARG;
  testing::internal::EqHelper::Compare<nsh_status,_nsh_status,_nullptr>
            ((EqHelper *)local_8c0,"status","NSH_STATUS_WRONG_ARG",
             (nsh_status *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),&local_8c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(local_8e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0xaa,message);
    testing::internal::AssertHelper::operator=(&local_8e8,local_8e0);
    testing::internal::AssertHelper::~AssertHelper(&local_8e8);
    testing::Message::~Message(local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  return;
}

Assistant:

TEST(NshHistoryGetEntry, FailureInvalidNegativeAge)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    char entry[NSH_LINE_BUFFER_SIZE] = {};
    auto status = nsh_history_get_entry(&hist, NSH_HISTORY_INVALID_ENTRY, entry);

    ASSERT_EQ(status, NSH_STATUS_WRONG_ARG);
}